

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcSymMetaclass::add_runtime_symbol(CTcSymMetaclass *this,CVmRuntimeSymbols *symtab)

{
  vm_val_t val;
  vm_val_t local_10;
  
  if (((this->super_CTcSymMetaclassBase).field_0x58 & 1) == 0) {
    local_10.val.obj = (this->super_CTcSymMetaclassBase).class_obj_;
    local_10.typ = VM_OBJ;
    CVmRuntimeSymbols::add_sym
              (symtab,(this->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
                      super_CVmHashEntryCS.super_CVmHashEntry.str_,
               (this->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
               super_CVmHashEntryCS.super_CVmHashEntry.len_,&local_10);
  }
  return;
}

Assistant:

void CTcSymMetaclass::add_runtime_symbol(CVmRuntimeSymbols *symtab)
{
    /* don't do this for external metaclasses */
    if (ext_)
        return;

    /* add our entry */
    vm_val_t val;
    val.set_obj(get_class_obj());
    symtab->add_sym(get_sym(), get_sym_len(), &val);
}